

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase78::run(TestCase78 *this)

{
  bool bVar1;
  bool local_5d9;
  undefined1 auStack_5d8 [7];
  bool _kj_shouldLog_4;
  Maybe<capnp::StructSchema::Field> local_5c8;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_580;
  undefined1 local_538 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_4;
  undefined1 auStack_4c8 [7];
  bool _kj_shouldLog_3;
  Maybe<capnp::StructSchema::Field> local_4b8;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_470;
  undefined1 local_428 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_3;
  undefined1 auStack_3b8 [7];
  bool _kj_shouldLog_2;
  Maybe<capnp::StructSchema::Field> local_3a8;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_360;
  undefined1 local_318 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_2;
  undefined1 auStack_2a8 [7];
  bool _kj_shouldLog_1;
  Maybe<capnp::StructSchema::Field> local_298;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_250;
  undefined1 local_208 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition_1;
  undefined1 auStack_198 [7];
  bool _kj_shouldLog;
  Maybe<capnp::StructSchema::Field> local_188;
  DebugExpression<kj::Maybe<capnp::StructSchema::Field>_> local_140;
  undefined1 local_f8 [8];
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> _kjCondition;
  Schema local_80;
  Reader local_78;
  Schema local_48;
  Schema local_40;
  StructSchema schema;
  SchemaLoader loader;
  TestCase78 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&schema);
  local_80.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestUnnamedUnion>();
  Schema::getProto(&local_78,&local_80);
  local_48 = SchemaLoader::load((SchemaLoader *)&schema,&local_78);
  local_40.raw = (RawBrandedSchema *)Schema::asStruct(&local_48);
  kj::StringPtr::StringPtr((StringPtr *)auStack_198,"");
  StructSchema::findFieldByName(&local_188,(StructSchema *)&local_40,(StringPtr)_auStack_198);
  kj::_::DebugExpressionStart::operator<<
            (&local_140,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator==
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_f8,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_140,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_140);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_188);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    _kjCondition_1._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x54,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"\\\") == kj::none\", _kjCondition"
                 ,(char (*) [56])"failed: expected schema.findFieldByName(\"\") == kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_f8);
      _kjCondition_1._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_f8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2a8,"foo");
  StructSchema::findFieldByName(&local_298,(StructSchema *)&local_40,(StringPtr)_auStack_2a8);
  kj::_::DebugExpressionStart::operator<<
            (&local_250,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_298);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_208,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_250,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_250);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_298);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_208);
  if (!bVar1) {
    _kjCondition_2._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x56,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"foo\\\") != kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected schema.findFieldByName(\"foo\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_208);
      _kjCondition_2._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_208);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3b8,"bar");
  StructSchema::findFieldByName(&local_3a8,(StructSchema *)&local_40,(StringPtr)_auStack_3b8);
  kj::_::DebugExpressionStart::operator<<
            (&local_360,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3a8);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_318,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_360,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_360);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_3a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_318);
  if (!bVar1) {
    _kjCondition_3._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x57,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"bar\\\") != kj::none\", _kjCondition"
                 ,(char (*) [59])"failed: expected schema.findFieldByName(\"bar\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_318);
      _kjCondition_3._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_318);
  kj::StringPtr::StringPtr((StringPtr *)auStack_4c8,"before");
  StructSchema::findFieldByName(&local_4b8,(StructSchema *)&local_40,(StringPtr)_auStack_4c8);
  kj::_::DebugExpressionStart::operator<<
            (&local_470,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4b8);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_428,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_470,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_470);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_4b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_428);
  if (!bVar1) {
    _kjCondition_4._103_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._103_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x58,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"before\\\") != kj::none\", _kjCondition"
                 ,(char (*) [62])"failed: expected schema.findFieldByName(\"before\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_428);
      _kjCondition_4._103_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_428);
  kj::StringPtr::StringPtr((StringPtr *)auStack_5d8,"after");
  StructSchema::findFieldByName(&local_5c8,(StructSchema *)&local_40,(StringPtr)_auStack_5d8);
  kj::_::DebugExpressionStart::operator<<
            (&local_580,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5c8);
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>>::operator!=
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_538,
             (DebugExpression<kj::Maybe<capnp::StructSchema::Field>> *)&local_580,(None *)&kj::none)
  ;
  kj::_::DebugExpression<kj::Maybe<capnp::StructSchema::Field>_>::~DebugExpression(&local_580);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_5c8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_538);
  if (!bVar1) {
    local_5d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5d9 != false) {
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x59,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"after\\\") != kj::none\", _kjCondition"
                 ,(char (*) [61])"failed: expected schema.findFieldByName(\"after\") != kj::none",
                 (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
                 local_538);
      local_5d9 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)local_538);
  SchemaLoader::~SchemaLoader((SchemaLoader *)&schema);
  return;
}

Assistant:

TEST(SchemaLoader, LoadUnnamedUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestUnnamedUnion>().getProto()).asStruct();

  EXPECT_TRUE(schema.findFieldByName("") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("foo") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("bar") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("before") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("after") != kj::none);
}